

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_render_content.cpp
# Opt level: O2

int __thiscall ONX_Model::AddRenderEnvironment(ONX_Model *this,wchar_t *candidate_name)

{
  bool bVar1;
  Type TVar2;
  int iVar3;
  wchar_t *component_name;
  ON_ModelComponent *pOVar4;
  uint in_stack_fffffffffffffd7c;
  ON_wString env_name;
  ON_ModelComponentReference mcr;
  ON_RenderEnvironment env;
  
  bVar1 = ON_ModelComponent::IsValidComponentName(candidate_name);
  iVar3 = -0x7fffffff;
  if (bVar1) {
    ON_RenderEnvironment::ON_RenderEnvironment((ON_RenderEnvironment *)&env.super_ON_RenderContent);
    ON_RenderContent::SetTypeId(&env.super_ON_RenderContent,&ON_RenderContentType_BasicEnvironment);
    TVar2 = ON_ModelComponent::ComponentType((ON_ModelComponent *)&env);
    ON_ComponentManifest::UnusedName
              ((ON_ComponentManifest *)&env_name,(char)this - 0x30,(ON_UUID)ZEXT116(TVar2),
               (wchar_t *)(uchar  [8])0x0,candidate_name,(wchar_t *)0x0,0,
               (uint *)((ulong)in_stack_fffffffffffffd7c << 0x20));
    component_name = ON_wString::operator_cast_to_wchar_t_(&env_name);
    ON_ModelComponent::SetName((ON_ModelComponent *)&env,component_name);
    AddModelComponent((ONX_Model *)&mcr,(ON_ModelComponent *)this,SUB81(&env,0));
    pOVar4 = ON_ModelComponentReference::ModelComponent(&mcr);
    pOVar4 = (ON_ModelComponent *)ON_RenderEnvironment::Cast(&pOVar4->super_ON_Object);
    if (pOVar4 == (ON_ModelComponent *)0x0) {
      iVar3 = -0x7fffffff;
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_render_content.cpp"
                 ,0x711,"","Failed to add render environment; AddModelComponent() failed");
    }
    else {
      iVar3 = ON_ModelComponent::Index(pOVar4);
    }
    ON_ModelComponentReference::~ON_ModelComponentReference(&mcr);
    ON_wString::~ON_wString(&env_name);
    ON_RenderEnvironment::~ON_RenderEnvironment(&env);
  }
  return iVar3;
}

Assistant:

int ONX_Model::AddRenderEnvironment(const wchar_t* candidate_name)
{
  if (!ON_ModelComponent::IsValidComponentName(candidate_name))
    return ON_UNSET_INT_INDEX;

  ON_RenderEnvironment env;
  env.SetTypeId(ON_RenderContentType_BasicEnvironment);

  const ON_wString env_name = m_manifest.UnusedName(env.ComponentType(), ON_nil_uuid, candidate_name,
                                                    nullptr, nullptr, 0, nullptr);
  env.SetName(env_name);

  const ON_ModelComponentReference mcr = AddModelComponent(env, true);
  const auto* model_env = ON_RenderEnvironment::Cast(mcr.ModelComponent());
  if (nullptr == model_env)
  {
    ON_ERROR("Failed to add render environment; AddModelComponent() failed");
    return ON_UNSET_INT_INDEX;
  }

  return model_env->Index();
}